

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O1

void __thiscall CCIT<UFPC>::FirstScan(CCIT<UFPC> *this)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  Mat1i *pMVar8;
  Mat1b *pMVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  uint *puVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  char *pcVar35;
  uint *puVar36;
  uint unaff_R12D;
  long lVar37;
  long lVar38;
  uint *img_labels_row_prev_prev;
  uchar *img_row_prev;
  uchar *img_row_fol;
  uchar *img_row;
  ulong local_98;
  long local_90;
  long local_88;
  long local_80;
  
  pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  memset(*(void **)&pMVar8->field_0x10,0,*(long *)&pMVar8->field_0x20 - *(long *)&pMVar8->field_0x18
        );
  puVar14 = UFPC::P_;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar6 = *(int *)&pMVar8->field_0xc;
  lVar38 = (long)iVar6;
  uVar7 = *(uint *)&pMVar8->field_0x8;
  uVar23 = (ulong)uVar7;
  if (0 < lVar38) {
    pMVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar10 = *(long *)&pMVar9->field_0x10;
    lVar11 = **(long **)&pMVar9->field_0x48;
    lVar2 = lVar10 + lVar11;
    lVar12 = *(long *)&pMVar8->field_0x10;
    iVar28 = 0;
    do {
      lVar32 = (long)iVar28;
      if (*(char *)(lVar10 + lVar32) == '\0') {
        lVar24 = lVar32 + 1;
        iVar31 = (int)lVar24;
        if ((iVar31 < iVar6) && (*(char *)(lVar10 + lVar24) != '\0')) {
LAB_001ce6f2:
          puVar14[UFPC::length_] = UFPC::length_;
          unaff_R12D = UFPC::length_;
          uVar15 = UFPC::length_ + 1;
          *(uint *)(lVar12 + lVar32 * 4) = UFPC::length_;
          UFPC::length_ = uVar15;
          bVar13 = true;
          goto LAB_001ce719;
        }
        if (((int)uVar7 < 2) || (*(char *)(lVar2 + lVar32) == '\0')) {
          bVar13 = false;
          if (((int)uVar7 < 2) || (iVar6 <= iVar31)) goto LAB_001ce719;
          if (*(char *)(lVar2 + lVar24) != '\0') goto LAB_001ce6f2;
        }
        else {
          puVar14[UFPC::length_] = UFPC::length_;
          unaff_R12D = UFPC::length_;
          uVar15 = UFPC::length_ + 1;
          *(uint *)(lVar12 + lVar32 * 4) = UFPC::length_;
          UFPC::length_ = uVar15;
          if (iVar31 < iVar6) {
            cVar5 = *(char *)(lVar2 + lVar24);
            goto joined_r0x001ce6d8;
          }
        }
LAB_001ce716:
        bVar13 = false;
      }
      else {
        puVar14[UFPC::length_] = UFPC::length_;
        unaff_R12D = UFPC::length_;
        uVar15 = UFPC::length_ + 1;
        *(uint *)(lVar12 + lVar32 * 4) = UFPC::length_;
        UFPC::length_ = uVar15;
        lVar32 = lVar32 + 1;
        if (iVar6 <= (int)lVar32) goto LAB_001ce716;
        bVar13 = true;
        if (*(char *)(lVar10 + lVar32) == '\0') {
          if (1 < (int)uVar7) {
            cVar5 = *(char *)(lVar2 + lVar32);
joined_r0x001ce6d8:
            bVar13 = true;
            if (cVar5 != '\0') goto LAB_001ce719;
          }
          goto LAB_001ce716;
        }
      }
LAB_001ce719:
      iVar31 = iVar28 + 2;
      if ((bVar13) && (iVar31 < iVar6)) {
        lVar32 = (long)iVar31;
        pcVar35 = (char *)(lVar10 + lVar32);
        puVar36 = (uint *)(lVar12 + lVar32 * 4);
        iVar28 = iVar28 + 3;
        do {
          iVar31 = iVar28;
          lVar32 = lVar32 + 2;
          if (*pcVar35 == '\0') {
            if ((iVar31 < iVar6) && (*(char *)(lVar10 + iVar31) != '\0')) {
              if (((int)uVar7 < 2) || (pcVar35[lVar11] == '\0')) {
LAB_001ce7cb:
                puVar14[UFPC::length_] = UFPC::length_;
                unaff_R12D = UFPC::length_;
                uVar15 = UFPC::length_ + 1;
                *puVar36 = UFPC::length_;
                UFPC::length_ = uVar15;
              }
              else {
                *puVar36 = unaff_R12D;
              }
              bVar13 = true;
              goto LAB_001ce7ed;
            }
            if (((int)uVar7 < 2) || (pcVar35[lVar11] == '\0')) {
              bVar13 = false;
              if (((int)uVar7 < 2) || (iVar6 <= iVar31)) goto LAB_001ce7ed;
              if (*(char *)(lVar2 + iVar31) != '\0') goto LAB_001ce7cb;
            }
            else {
              *puVar36 = unaff_R12D;
              if (iVar31 < iVar6) goto LAB_001ce7ab;
            }
LAB_001ce7eb:
            bVar13 = false;
          }
          else {
            *puVar36 = unaff_R12D;
            if (iVar6 <= iVar31) goto LAB_001ce7eb;
            bVar13 = true;
            if (*(char *)(lVar10 + iVar31) == '\0') {
              if (1 < (int)uVar7) {
LAB_001ce7ab:
                bVar13 = true;
                if (*(char *)(lVar2 + iVar31) != '\0') goto LAB_001ce7ed;
              }
              goto LAB_001ce7eb;
            }
          }
LAB_001ce7ed:
          if (!bVar13) break;
          pcVar35 = pcVar35 + 2;
          puVar36 = puVar36 + 2;
          iVar28 = iVar31 + 2;
        } while (lVar32 < lVar38);
        iVar31 = iVar31 + 1;
      }
      iVar28 = iVar31;
    } while (iVar31 < iVar6);
  }
  if (2 < (int)uVar7) {
    local_98 = 2;
    local_80 = 1;
    local_88 = 3;
    local_90 = 0;
    do {
      if (0 < iVar6) {
        pMVar9 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar2 = *(long *)&pMVar9->field_0x10;
        lVar10 = **(long **)&pMVar9->field_0x48;
        lVar32 = lVar10 * local_98 + lVar2;
        lVar33 = lVar32 - lVar10;
        lVar24 = lVar32 + lVar10;
        lVar11 = *(long *)&pMVar8->field_0x10;
        lVar12 = **(long **)&pMVar8->field_0x48;
        lVar37 = lVar12 * local_98 + lVar11;
        lVar34 = lVar37 + lVar12 * -2;
        uVar30 = local_98 | 1;
        uVar29 = 0;
        do {
          iVar28 = (int)uVar29;
          uVar18 = (ulong)iVar28;
          uVar1 = uVar18 + 1;
          iVar31 = (int)uVar1;
          uVar15 = UFPC::length_;
          if (*(char *)(lVar32 + uVar18) == '\0') {
            if ((iVar6 <= iVar31) || (*(char *)(lVar32 + uVar1) == '\0')) {
              if ((uVar30 < uVar23) && (*(char *)(lVar24 + uVar18) != '\0')) {
                UFPC::P_[UFPC::length_] = UFPC::length_;
                unaff_R12D = UFPC::length_;
                uVar15 = UFPC::length_ + 1;
                *(uint *)(lVar37 + uVar18 * 4) = UFPC::length_;
                UFPC::length_ = uVar15;
                if (iVar6 <= iVar31) goto LAB_001ceaae;
                goto LAB_001cea9c;
              }
              bVar13 = false;
              if ((uVar23 <= uVar30) || (iVar6 <= iVar31)) goto LAB_001ceb8a;
              if (*(char *)(lVar24 + uVar1) != '\0') goto LAB_001ceb67;
              goto LAB_001ceaae;
            }
            if (*(char *)(lVar33 + uVar1) == '\0') {
              if (*(char *)(lVar33 + uVar18) != '\0') {
                unaff_R12D = *(uint *)(lVar34 + uVar18 * 4);
                *(uint *)(lVar37 + uVar18 * 4) = unaff_R12D;
                goto LAB_001ceb24;
              }
LAB_001ceb49:
              if (((int)(uVar18 + 2) < iVar6) && (*(char *)(lVar33 + uVar18 + 2) != '\0')) {
                unaff_R12D = *(uint *)(lVar34 + 8 + uVar18 * 4);
              }
              else {
LAB_001ceb67:
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar15 = UFPC::length_ + 1;
                unaff_R12D = UFPC::length_;
              }
            }
            else {
              unaff_R12D = *(uint *)(lVar34 + uVar18 * 4);
            }
            UFPC::length_ = uVar15;
            *(uint *)(lVar37 + uVar18 * 4) = unaff_R12D;
            bVar13 = true;
          }
          else if ((iVar31 < iVar6) && (*(char *)(lVar32 + uVar1) != '\0')) {
            if (*(char *)(lVar33 + uVar18) == '\0') {
              if (*(char *)(lVar33 + uVar1) == '\0') {
                if ((iVar28 < 2) || (*(char *)(lVar33 + -1 + uVar18) == '\0')) goto LAB_001ceb49;
                unaff_R12D = *(uint *)(lVar34 + -8 + uVar18 * 4);
                *(uint *)(lVar37 + uVar18 * 4) = unaff_R12D;
                uVar18 = uVar29;
                goto LAB_001ceb24;
              }
              unaff_R12D = *(uint *)(lVar34 + uVar18 * 4);
              *(uint *)(lVar37 + uVar18 * 4) = unaff_R12D;
              bVar13 = true;
              if ((iVar28 < 2) || (*(char *)(lVar33 + -1 + uVar18) == '\0')) goto LAB_001ceb8a;
              uVar15 = *(uint *)(lVar34 + -8 + uVar18 * 4);
            }
            else {
              unaff_R12D = *(uint *)(lVar34 + uVar18 * 4);
              *(uint *)(lVar37 + uVar18 * 4) = unaff_R12D;
              bVar13 = true;
              if (*(char *)(lVar33 + uVar1) != '\0') goto LAB_001ceb8a;
LAB_001ceb24:
              bVar13 = true;
              if ((iVar6 <= (int)(uVar18 + 2)) || (*(char *)(lVar33 + uVar18 + 2) == '\0'))
              goto LAB_001ceb8a;
              uVar15 = *(uint *)(lVar34 + 8 + uVar18 * 4);
            }
            bVar13 = true;
            UFPC::Merge(unaff_R12D,uVar15);
          }
          else {
            if (*(char *)(lVar33 + uVar18) == '\0') {
              if ((iVar28 < 2) || (*(char *)(lVar33 + -1 + uVar18) == '\0')) {
                if ((iVar31 < iVar6) && (*(char *)(lVar33 + uVar1) != '\0')) goto LAB_001ce962;
                UFPC::P_[UFPC::length_] = UFPC::length_;
                unaff_R12D = UFPC::length_;
                UFPC::length_ = UFPC::length_ + 1;
                goto LAB_001cea87;
              }
              unaff_R12D = *(uint *)(lVar34 + -8 + uVar18 * 4);
              *(uint *)(lVar37 + uVar18 * 4) = unaff_R12D;
              if ((iVar31 < iVar6) && (*(char *)(lVar33 + (uVar1 & 0xffffffff)) != '\0')) {
                UFPC::Merge(unaff_R12D,*(uint *)(lVar34 + uVar18 * 4));
              }
            }
            else {
LAB_001ce962:
              unaff_R12D = *(uint *)(lVar34 + uVar18 * 4);
LAB_001cea87:
              *(uint *)(lVar37 + uVar18 * 4) = unaff_R12D;
            }
            if ((iVar31 < iVar6) && (uVar30 < uVar23)) {
LAB_001cea9c:
              bVar13 = true;
              if (*(char *)(lVar24 + uVar1) != '\0') goto LAB_001ceb8a;
            }
LAB_001ceaae:
            bVar13 = false;
          }
LAB_001ceb8a:
          uVar15 = iVar28 + 2;
          if ((bVar13) && ((int)uVar15 < iVar6)) {
            lVar25 = (long)(int)uVar15;
            lVar3 = lVar37 + lVar25 * 4;
            lVar19 = lVar10 * local_80 + lVar2 + lVar25;
            lVar4 = lVar12 * local_90 + lVar11 + lVar25 * 4;
            lVar20 = lVar10 * local_88 + lVar2 + lVar25;
            lVar27 = 0;
            do {
              uVar1 = uVar29 + 3 + lVar27;
              iVar17 = (int)uVar1;
              iVar31 = (int)lVar27;
              if (*(char *)(lVar32 + lVar25 + lVar27) == '\0') {
                if ((iVar17 < iVar6) && (lVar21 = (long)iVar17, *(char *)(lVar32 + lVar21) != '\0'))
                {
                  if ((uVar23 <= uVar30) || (*(char *)(lVar20 + lVar27) == '\0')) {
                    uVar15 = UFPC::length_;
                    if (*(char *)(lVar33 + lVar21) == '\0') {
                      if (*(char *)(lVar19 + lVar27) != '\0') {
                        unaff_R12D = *(uint *)(lVar4 + lVar27 * 4);
                        *(uint *)(lVar3 + lVar27 * 4) = unaff_R12D;
                        iVar31 = iVar31 + iVar28 + 4;
                        bVar13 = true;
                        if ((iVar31 < iVar6) &&
                           (lVar21 = (long)iVar31, *(char *)(lVar33 + lVar21) != '\0'))
                        goto LAB_001cef3f;
                        goto LAB_001cee75;
                      }
                      iVar31 = iVar31 + iVar28 + 4;
                      if ((iVar6 <= iVar31) || (*(char *)(lVar33 + iVar31) == '\0'))
                      goto LAB_001ced7e;
                      unaff_R12D = *(uint *)(lVar34 + (long)iVar31 * 4);
                    }
                    else {
                      unaff_R12D = *(uint *)(lVar4 + lVar27 * 4);
                    }
LAB_001cee26:
                    UFPC::length_ = uVar15;
                    *(uint *)(lVar3 + lVar27 * 4) = unaff_R12D;
                    goto LAB_001cee72;
                  }
                  *(uint *)(lVar3 + lVar27 * 4) = unaff_R12D;
                  if (*(char *)(lVar33 + lVar21) == '\0') {
                    if (*(char *)(lVar19 + lVar27) != '\0') {
                      iVar17 = iVar31 + iVar28 + 4;
                      if ((iVar17 < iVar6) && (*(char *)(lVar33 + iVar17) != '\0')) {
                        uVar15 = UFPC::Merge(*(uint *)(lVar4 + lVar27 * 4),
                                             *(uint *)(lVar34 + (long)iVar17 * 4));
                      }
                      else {
                        uVar15 = *(uint *)(lVar4 + lVar27 * 4);
                      }
                      goto LAB_001cefce;
                    }
                  }
                  else {
                    uVar15 = *(uint *)(lVar4 + lVar27 * 4);
LAB_001cefce:
                    UFPC::Merge(unaff_R12D,uVar15);
                  }
                  iVar31 = iVar31 + iVar28 + 4;
                  if ((iVar31 < iVar6) && (*(char *)(lVar33 + iVar31) != '\0')) {
                    uVar15 = *(uint *)(lVar34 + (long)iVar31 * 4);
                    goto LAB_001ceffd;
                  }
LAB_001cf002:
                  bVar13 = true;
                  goto LAB_001cee75;
                }
                if ((uVar23 <= uVar30) || (*(char *)(lVar20 + lVar27) == '\0')) {
                  bVar13 = false;
                  if ((uVar30 < uVar23) && (iVar17 < iVar6)) {
                    if (*(char *)(lVar24 + iVar17) != '\0') {
LAB_001ced7e:
                      UFPC::P_[UFPC::length_] = UFPC::length_;
                      uVar15 = UFPC::length_ + 1;
                      unaff_R12D = UFPC::length_;
                      goto LAB_001cee26;
                    }
                    goto LAB_001cee0a;
                  }
                  goto LAB_001cee75;
                }
                *(uint *)(lVar3 + lVar27 * 4) = unaff_R12D;
                if (iVar17 < iVar6) goto LAB_001cecbb;
LAB_001cee0a:
                bVar13 = false;
              }
              else {
                uVar18 = lVar27 + uVar29;
                *(uint *)(lVar3 + lVar27 * 4) = unaff_R12D;
                iVar16 = (int)uVar18;
                if ((iVar6 <= iVar17) || (*(char *)(lVar32 + iVar17) == '\0')) {
                  *(uint *)(lVar3 + lVar27 * 4) = unaff_R12D;
                  if (*(char *)(lVar19 + lVar27) == '\0') {
                    if ((-1 < iVar16) &&
                       (uVar18 = uVar18 & 0xffffffff, *(char *)(lVar33 + 1 + uVar18) != '\0')) {
                      if ((iVar17 < iVar6) && (*(char *)(lVar33 + (uVar1 & 0xffffffff)) != '\0')) {
                        uVar15 = UFPC::Merge(*(uint *)(lVar34 + uVar18 * 4),
                                             *(uint *)(lVar4 + lVar27 * 4));
                      }
                      else {
                        uVar15 = *(uint *)(lVar34 + uVar18 * 4);
                      }
                      goto LAB_001cec97;
                    }
                    if (iVar6 <= iVar17) goto LAB_001cee0a;
                    if (*(char *)(lVar33 + iVar17) != '\0') goto LAB_001cec8f;
                  }
                  else {
LAB_001cec8f:
                    uVar15 = *(uint *)(lVar4 + lVar27 * 4);
LAB_001cec97:
                    UFPC::Merge(unaff_R12D,uVar15);
                  }
                  if ((iVar17 < iVar6) && (uVar30 < uVar23)) {
LAB_001cecbb:
                    bVar13 = true;
                    if (*(char *)(lVar24 + iVar17) != '\0') goto LAB_001cee75;
                  }
                  goto LAB_001cee0a;
                }
                cVar5 = *(char *)(lVar33 + iVar17);
                if (*(char *)(lVar19 + lVar27) == '\0') {
                  if (cVar5 != '\0') {
                    if ((iVar16 < 0) || (*(char *)(lVar33 + 1 + (uVar18 & 0xffffffff)) == '\0'))
                    goto LAB_001cee5f;
                    uVar15 = *(uint *)(lVar34 + (uVar18 & 0xffffffff) * 4);
                    uVar22 = *(uint *)(lVar4 + lVar27 * 4);
                    goto LAB_001cee53;
                  }
                  if ((-1 < iVar16) &&
                     (uVar18 = uVar18 & 0xffffffff, *(char *)(lVar33 + 1 + uVar18) != '\0')) {
                    uVar22 = iVar31 + iVar28 + 4;
                    if (((int)uVar22 < iVar6) && (*(char *)(lVar33 + (ulong)uVar22) != '\0')) {
                      uVar15 = *(uint *)(lVar34 + uVar18 * 4);
                      uVar22 = *(uint *)(lVar34 + (ulong)uVar22 * 4);
                      goto LAB_001cee53;
                    }
                    uVar15 = *(uint *)(lVar34 + uVar18 * 4);
                    goto LAB_001cee6a;
                  }
                  iVar31 = iVar31 + iVar28 + 4;
                  bVar13 = true;
                  if ((iVar6 <= iVar31) ||
                     (lVar21 = (long)iVar31, *(char *)(lVar33 + lVar21) == '\0')) goto LAB_001cee75;
LAB_001cef3f:
                  uVar15 = *(uint *)(lVar34 + lVar21 * 4);
LAB_001ceffd:
                  UFPC::Merge(unaff_R12D,uVar15);
                  goto LAB_001cf002;
                }
                if (((cVar5 == '\0') && (iVar31 = iVar31 + iVar28 + 4, iVar31 < iVar6)) &&
                   (*(char *)(lVar33 + iVar31) != '\0')) {
                  uVar15 = *(uint *)(lVar4 + lVar27 * 4);
                  uVar22 = *(uint *)(lVar34 + (long)iVar31 * 4);
LAB_001cee53:
                  uVar15 = UFPC::Merge(uVar15,uVar22);
                }
                else {
LAB_001cee5f:
                  uVar15 = *(uint *)(lVar4 + lVar27 * 4);
                }
LAB_001cee6a:
                UFPC::Merge(unaff_R12D,uVar15);
LAB_001cee72:
                bVar13 = true;
              }
LAB_001cee75:
              lVar21 = lVar27 + 2;
            } while ((bVar13) && (lVar26 = lVar25 + lVar27, lVar27 = lVar21, lVar26 + 2 < lVar38));
            uVar15 = (int)lVar21 + iVar28 + 2;
          }
          uVar29 = (ulong)uVar15;
        } while ((int)uVar15 < iVar6);
      }
      local_98 = local_98 + 2;
      local_80 = local_80 + 2;
      local_90 = local_90 + 2;
      local_88 = local_88 + 2;
    } while ((int)local_98 < (int)uVar7);
  }
  return;
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // First Scan
        int w = img_labels_.cols;
        int h = img_labels_.rows;

        int lx, u, v, k;

#define CONDITION_B1 img_row[x] > 0 
#define CONDITION_B2 x+1<w && img_row[x+1] > 0              // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img_row_fol[x] > 0            // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img_row_fol[x+1] > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img_row_prev[x-1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U2 img_row_prev[x] > 0
#define CONDITION_U3 x+1<w && img_row_prev[x+1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img_row_prev[x+2] > 0         // WRONG in the original code -> add missing condition
#define ASSIGN_S img_labels_row[x] = img_labels_row[x-2]
#define ASSIGN_P img_labels_row[x] = img_labels_row_prev_prev[x-2]
#define ASSIGN_Q img_labels_row[x] = img_labels_row_prev_prev[x]
#define ASSIGN_R img_labels_row[x] = img_labels_row_prev_prev[x+2]
#define ASSIGN_LX img_labels_row[x] = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels_row_prev_prev[x-2]
#define LOAD_PV v = img_labels_row_prev_prev[x-2]
#define LOAD_QU u = img_labels_row_prev_prev[x]
#define LOAD_QV v = img_labels_row_prev_prev[x]
#define LOAD_QK k = img_labels_row_prev_prev[x]
#define LOAD_RV v = img_labels_row_prev_prev[x+2]
#define LOAD_RK k = img_labels_row_prev_prev[x+2]
#define NEW_LABEL lx = img_labels_row[x] = LabelsSolver::NewLabel();
#define RESOLVE_2(u, v) LabelsSolver::Merge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::Merge(u,LabelsSolver::Merge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        const unsigned char* const img_row = img_.ptr<unsigned char>(y);
        const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
        unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }